

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::expand
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this)

{
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  
  sVar6 = 8;
  if (this->_capacity != 0) {
    sVar6 = this->_capacity * 2;
  }
  uVar3 = sVar6 * 0x30;
  if (uVar3 == 0) {
    pMVar2 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar3 < 0x21) {
    pMVar2 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar3 < 0x31) {
    pMVar2 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar3 < 0x41) {
    pMVar2 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pMVar2 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)::operator_new(uVar3,0x10);
  }
  if (this->_capacity == 0) {
    uVar3 = 0;
  }
  else {
    lVar5 = 0;
    uVar4 = 0;
    do {
      pMVar1 = this->_stack;
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)((long)&(pMVar2->numeral)._num._val[0]._mp_alloc + lVar5),
                 (IntegerConstantType *)((long)&(pMVar1->numeral)._num._val[0]._mp_alloc + lVar5));
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)((long)&(pMVar2->numeral)._den._val[0]._mp_alloc + lVar5),
                 (IntegerConstantType *)((long)&(pMVar1->numeral)._den._val[0]._mp_alloc + lVar5));
      *(undefined4 *)
       ((long)&((Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
                 *)(&pMVar2->numeral + 1))->_id + lVar5) =
           *(undefined4 *)
            ((long)&((Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
                      *)(&pMVar1->numeral + 1))->_id + lVar5);
      *(undefined8 *)
       ((long)&((Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
                 *)(&pMVar2->numeral + 1))->_ptr + lVar5) =
           *(undefined8 *)
            ((long)&((Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
                      *)(&pMVar1->numeral + 1))->_ptr + lVar5);
      pMVar1 = this->_stack;
      mpz_clear((__mpz_struct *)((long)&(pMVar1->numeral)._den._val[0]._mp_alloc + lVar5));
      mpz_clear((__mpz_struct *)((long)&(pMVar1->numeral)._num._val[0]._mp_alloc + lVar5));
      uVar4 = uVar4 + 1;
      uVar3 = this->_capacity;
      lVar5 = lVar5 + 0x30;
    } while (uVar4 < uVar3);
    pMVar1 = this->_stack;
    if (pMVar1 != (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0) {
      uVar4 = uVar3 * 0x30;
      if (uVar4 == 0) {
        (pMVar1->numeral)._num._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
        (pMVar1->numeral)._num._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pMVar1;
      }
      else if (uVar4 < 0x11) {
        (pMVar1->numeral)._num._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
        (pMVar1->numeral)._num._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pMVar1;
      }
      else if (uVar4 < 0x19) {
        (pMVar1->numeral)._num._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
        (pMVar1->numeral)._num._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pMVar1;
      }
      else if (uVar4 < 0x21) {
        (pMVar1->numeral)._num._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
        (pMVar1->numeral)._num._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pMVar1;
      }
      else if (uVar4 < 0x31) {
        (pMVar1->numeral)._num._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
        (pMVar1->numeral)._num._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pMVar1;
      }
      else if (uVar4 < 0x41) {
        (pMVar1->numeral)._num._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
        (pMVar1->numeral)._num._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pMVar1;
      }
      else {
        operator_delete(pMVar1,0x10);
        uVar3 = this->_capacity;
      }
    }
  }
  this->_stack = pMVar2;
  this->_cursor = pMVar2 + uVar3;
  this->_end = pMVar2 + sVar6;
  this->_capacity = sVar6;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }